

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::SpirVSource::~SpirVSource(SpirVSource *this)

{
  SpirVSource *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SpirVSource_00144aa8;
  std::__cxx11::string::~string((string *)&this->source);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~SpirVSource		(void) {}